

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O1

bool __thiscall draco::CornerTable::BreakNonManifoldEdges(CornerTable *this)

{
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar1;
  uint uVar2;
  pointer pIVar3;
  pointer pIVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  CornerTable *pCVar10;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *attached_sink_vertex;
  ulong uVar11;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *ppVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  new_sink_vert;
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  sink_vertices;
  vector<bool,_std::allocator<bool>_> visited_corners;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  local_90;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_88;
  iterator iStack_80;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_78;
  ulong local_70;
  CornerTable *local_68;
  vector<bool,_std::allocator<bool>_> local_60;
  ulong local_38;
  
  local_88 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)((ulong)local_88 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_60,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (bool *)&local_88,(allocator_type *)&local_90);
  local_88 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)0x0;
  iStack_80._M_current =
       (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
        *)0x0;
  local_78 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
              *)0x0;
  local_68 = this;
  do {
    if ((int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->corner_to_vertex_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) == 0) break;
    uVar11 = 0;
    local_70 = 0;
    do {
      local_38 = uVar11;
      if ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        if (iStack_80._M_current != local_88) {
          iStack_80._M_current = local_88;
        }
        uVar9 = uVar11 & 0xffffffff;
        do {
          uVar14 = uVar9;
          iVar6 = (int)uVar14;
          uVar9 = uVar14;
          if (iVar6 != -1) {
            uVar9 = (ulong)(iVar6 - 2);
            if (0x55555555 < (iVar6 + 1U) * -0x55555555) {
              uVar9 = (ulong)(iVar6 + 1U);
            }
          }
          if ((int)uVar9 != -1) {
            uVar9 = (ulong)(this->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9].value_;
          }
          iVar7 = (int)uVar9;
          if (iVar7 != -1) {
            uVar9 = (ulong)(iVar7 - 2);
            if (0x55555555 < (iVar7 + 1U) * -0x55555555) {
              uVar9 = (ulong)(iVar7 + 1U);
            }
          }
          pCVar10 = this;
        } while (((uVar11 != uVar9) && ((int)uVar9 != -1)) &&
                ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >>
                  (uVar9 & 0x3f) & 1) == 0));
        do {
          this = local_68;
          uVar13 = (uint)uVar14;
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] =
               local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
          uVar11 = uVar14;
          if (uVar13 != 0xffffffff) {
            uVar11 = (ulong)(uVar13 - 2);
            if (0x55555555 < (uVar13 + 1) * -0x55555555) {
              uVar11 = (ulong)(uVar13 + 1);
            }
          }
          pIVar3 = (pCVar10->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          IVar1.value_ = pIVar3[uVar11].value_;
          uVar9 = uVar14;
          if (uVar13 != 0xffffffff) {
            uVar9 = (ulong)(((uVar13 * -0x55555555 < 0x55555556) - 1 | 2) + uVar13);
          }
          if (local_88 == iStack_80._M_current) {
            bVar5 = false;
          }
          else {
            pIVar4 = (pCVar10->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            bVar5 = false;
            ppVar12 = local_88;
            do {
              if ((ppVar12->first).value_ == IVar1.value_) {
                uVar8 = (uint)uVar9;
                if ((uint)uVar9 != 0xffffffff) {
                  uVar8 = pIVar4[uVar9].value_;
                }
                uVar2 = (ppVar12->second).value_;
                iVar7 = 0xc;
                if (uVar8 != uVar2) {
                  uVar15 = uVar2;
                  if (uVar2 != 0xffffffff) {
                    uVar15 = pIVar4[uVar2].value_;
                  }
                  if (uVar8 != 0xffffffff) {
                    pIVar4[uVar8].value_ = 0xffffffff;
                  }
                  if (uVar15 != 0xffffffff) {
                    pIVar4[uVar15].value_ = 0xffffffff;
                  }
                  pIVar4[uVar9].value_ = 0xffffffff;
                  pIVar4[uVar2].value_ = 0xffffffff;
                  iVar7 = 0xb;
                  bVar5 = true;
                }
              }
              else {
                iVar7 = 0;
              }
            } while (((iVar7 == 0xc) || (iVar7 == 0)) &&
                    (ppVar12 = ppVar12 + 1, ppVar12 != iStack_80._M_current));
          }
          if (bVar5) {
            local_70 = CONCAT71((int7)(uVar11 >> 8),1);
          }
          else {
            uVar8 = uVar13;
            if (uVar13 != 0xffffffff) {
              uVar8 = ((uVar13 * -0x55555555 < 0x55555556) - 1 | 2) + uVar13;
            }
            local_90.second.value_ = (uint)uVar11;
            local_90.first.value_ = pIVar3[uVar8].value_;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>
              ::
              _M_realloc_insert<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>const&>
                        ((vector<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>,std::allocator<std::pair<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>
                          *)&local_88,iStack_80,&local_90);
            }
            else {
              *iStack_80._M_current = local_90;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            if (uVar13 != 0xffffffff) {
              uVar14 = (ulong)(((uVar13 * -0x55555555 < 0x55555556) - 1 | 2) + uVar13);
            }
            if ((int)uVar14 != -1) {
              uVar14 = (ulong)(this->opposite_corners_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
            }
            iVar7 = (int)uVar14;
            if (iVar7 != -1) {
              uVar14 = (ulong)((((uint)(iVar7 * -0x55555555) < 0x55555556) - 1 | 2) + iVar7);
            }
          }
        } while ((((int)uVar14 != -1) && ((int)uVar14 != iVar6)) &&
                (pCVar10 = this, (bool)(bVar5 ^ 1)));
      }
      uVar11 = local_38 + 1;
    } while (uVar11 < ((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff));
  } while ((local_70 & 1) != 0);
  if (local_88 !=
      (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
       *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return true;
}

Assistant:

bool CornerTable::BreakNonManifoldEdges() {
  // This function detects and breaks non-manifold edges that are caused by
  // folds in 1-ring neighborhood around a vertex. Non-manifold edges can occur
  // when the 1-ring surface around a vertex self-intersects in a common edge.
  // For example imagine a surface around a pivot vertex 0, where the 1-ring
  // is defined by vertices |1, 2, 3, 1, 4|. The surface passes edge <0, 1>
  // twice which would result in a non-manifold edge that needs to be broken.
  // For now all faces connected to these non-manifold edges are disconnected
  // resulting in open boundaries on the mesh. New vertices will be created
  // automatically for each new disjoint patch in the ComputeVertexCorners()
  // method.
  // Note that all other non-manifold edges are implicitly handled by the
  // function ComputeVertexCorners() that automatically creates new vertices
  // on disjoint 1-ring surface patches.

  std::vector<bool> visited_corners(num_corners(), false);
  std::vector<std::pair<VertexIndex, CornerIndex>> sink_vertices;
  bool mesh_connectivity_updated = false;
  do {
    mesh_connectivity_updated = false;
    for (CornerIndex c(0); c < num_corners(); ++c) {
      if (visited_corners[c.value()]) {
        continue;
      }
      sink_vertices.clear();

      // First swing all the way to find the left-most corner connected to the
      // corner's vertex.
      CornerIndex first_c = c;
      CornerIndex current_c = c;
      CornerIndex next_c;
      while (next_c = SwingLeft(current_c),
             next_c != first_c && next_c != kInvalidCornerIndex &&
                 !visited_corners[next_c.value()]) {
        current_c = next_c;
      }

      first_c = current_c;

      // Swing right from the first corner and check if all visited edges
      // are unique.
      do {
        visited_corners[current_c.value()] = true;
        // Each new edge is defined by the pivot vertex (that is the same for
        // all faces) and by the sink vertex (that is the |next| vertex from the
        // currently processed pivot corner. I.e., each edge is uniquely defined
        // by the sink vertex index.
        const CornerIndex sink_c = Next(current_c);
        const VertexIndex sink_v = corner_to_vertex_map_[sink_c];

        // Corner that defines the edge on the face.
        const CornerIndex edge_corner = Previous(current_c);
        bool vertex_connectivity_updated = false;
        // Go over all processed edges (sink vertices). If the current sink
        // vertex has been already encountered before it may indicate a
        // non-manifold edge that needs to be broken.
        for (auto &&attached_sink_vertex : sink_vertices) {
          if (attached_sink_vertex.first == sink_v) {
            // Sink vertex has been already processed.
            const CornerIndex other_edge_corner = attached_sink_vertex.second;
            const CornerIndex opp_edge_corner = Opposite(edge_corner);

            if (opp_edge_corner == other_edge_corner) {
              // We are closing the loop so no need to change the connectivity.
              continue;
            }

            // Break the connectivity on the non-manifold edge.
            // TODO(ostava): It may be possible to reconnect the faces in a way
            // that the final surface would be manifold.
            const CornerIndex opp_other_edge_corner =
                Opposite(other_edge_corner);
            if (opp_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_edge_corner, kInvalidCornerIndex);
            }
            if (opp_other_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_other_edge_corner, kInvalidCornerIndex);
            }

            SetOppositeCorner(edge_corner, kInvalidCornerIndex);
            SetOppositeCorner(other_edge_corner, kInvalidCornerIndex);

            vertex_connectivity_updated = true;
            break;
          }
        }
        if (vertex_connectivity_updated) {
          // Because of the updated connectivity, not all corners connected to
          // this vertex have been processed and we need to go over them again.
          // TODO(ostava): This can be optimized as we don't really need to
          // iterate over all corners.
          mesh_connectivity_updated = true;
          break;
        }
        // Insert new sink vertex information <sink vertex index, edge corner>.
        std::pair<VertexIndex, CornerIndex> new_sink_vert;
        new_sink_vert.first = corner_to_vertex_map_[Previous(current_c)];
        new_sink_vert.second = sink_c;
        sink_vertices.push_back(new_sink_vert);

        current_c = SwingRight(current_c);
      } while (current_c != first_c && current_c != kInvalidCornerIndex);
    }
  } while (mesh_connectivity_updated);
  return true;
}